

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::TParseContext::~TParseContext(TParseContext *this)

{
  TParseContext *this_local;
  
  (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
       (_func_int **)&PTR__TParseContext_013b08f0;
  if (this->atomicUintOffsets != (int *)0x0) {
    operator_delete__(this->atomicUintOffsets);
  }
  TVector<glslang::TSymbol_*>::~TVector(&this->ioArraySymbolResizeList);
  std::
  map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
  ::~map(&this->packingFixRecord);
  std::
  map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
  ::~map(&this->matrixFixRecord);
  TVector<glslang::TIntermTyped_*>::~TVector(&this->needsIndexLimitationChecking);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
            (&this->inductiveLoopIds);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&this->currentCaller);
  TPrecisionManager::~TPrecisionManager(&this->precisionManager);
  TParseContextBase::~TParseContextBase(&this->super_TParseContextBase);
  return;
}

Assistant:

TParseContext::~TParseContext()
{
    delete [] atomicUintOffsets;
}